

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

int verify_sign(void *verify_ctx,uint16_t algo,ptls_iovec_t data,ptls_iovec_t signature)

{
  EVP_PKEY_CTX *pEVar1;
  uint16_t uVar2;
  int iVar3;
  st_ptls_openssl_signature_scheme_t *psVar4;
  EVP_MD_CTX *ctx;
  EVP_MD *type;
  EVP_MD *pEVar5;
  uint8_t *puVar6;
  int iVar7;
  _func_EVP_MD_ptr **pp_Var8;
  EVP_PKEY_CTX *pkey_ctx;
  EVP_PKEY_CTX *local_50;
  size_t local_48;
  uint8_t *local_40;
  size_t local_38;
  
  puVar6 = data.base;
  local_50 = (EVP_PKEY_CTX *)0x0;
  if (puVar6 == (uint8_t *)0x0) {
    ctx = (EVP_MD_CTX *)0x0;
LAB_0010783f:
    iVar7 = 0;
  }
  else {
    local_40 = signature.base;
    local_38 = data.len;
    psVar4 = lookup_signature_schemes((EVP_PKEY *)verify_ctx);
    iVar7 = 0x203;
    if (psVar4 == (st_ptls_openssl_signature_scheme_t *)0x0) {
LAB_001078a6:
      ctx = (EVP_MD_CTX *)0x0;
    }
    else {
      uVar2 = psVar4->scheme_id;
      if (uVar2 != 0xffff) {
        pp_Var8 = &psVar4->scheme_md;
        do {
          local_48 = signature.len;
          if (uVar2 == algo) {
            ctx = (EVP_MD_CTX *)EVP_MD_CTX_new();
            if (ctx == (EVP_MD_CTX *)0x0) {
              iVar7 = 0x201;
              goto LAB_001078a6;
            }
            iVar3 = EVP_PKEY_get_id(verify_ctx);
            if (iVar3 == 0x43f) {
              iVar3 = EVP_DigestVerifyInit
                                (ctx,&local_50,(EVP_MD *)0x0,(ENGINE *)0x0,(EVP_PKEY *)verify_ctx);
              if (iVar3 != 1) goto LAB_001078a9;
              iVar3 = EVP_DigestVerify(ctx,local_40,local_48,puVar6,local_38);
            }
            else {
              type = (EVP_MD *)(**pp_Var8)();
              iVar3 = EVP_DigestVerifyInit(ctx,&local_50,type,(ENGINE *)0x0,(EVP_PKEY *)verify_ctx);
              if (iVar3 != 1) goto LAB_001078a9;
              iVar3 = EVP_PKEY_get_id(verify_ctx);
              if (iVar3 == 6) {
                iVar3 = EVP_PKEY_CTX_set_rsa_padding(local_50,6);
                if ((iVar3 != 1) ||
                   (iVar3 = EVP_PKEY_CTX_set_rsa_pss_saltlen(local_50,0xffffffff), pEVar1 = local_50
                   , iVar3 != 1)) goto LAB_001078a9;
                pEVar5 = (**pp_Var8)();
                iVar3 = EVP_PKEY_CTX_set_rsa_mgf1_md(pEVar1,pEVar5);
                if (iVar3 != 1) goto LAB_001078a9;
              }
              iVar3 = EVP_DigestVerifyUpdate(ctx,puVar6,local_38);
              if (iVar3 != 1) goto LAB_001078a9;
              iVar3 = EVP_DigestVerifyFinal(ctx,local_40,local_48);
              iVar7 = 0x33;
            }
            if (iVar3 != 1) goto LAB_001078a9;
            goto LAB_0010783f;
          }
          uVar2 = *(uint16_t *)(pp_Var8 + 1);
          pp_Var8 = pp_Var8 + 2;
        } while (uVar2 != 0xffff);
      }
      ctx = (EVP_MD_CTX *)0x0;
      iVar7 = 0x2f;
    }
  }
LAB_001078a9:
  if (ctx != (EVP_MD_CTX *)0x0) {
    EVP_MD_CTX_free(ctx);
  }
  EVP_PKEY_free((EVP_PKEY *)verify_ctx);
  return iVar7;
}

Assistant:

static int verify_sign(void *verify_ctx, uint16_t algo, ptls_iovec_t data, ptls_iovec_t signature)
{
    EVP_PKEY *key = verify_ctx;
    const struct st_ptls_openssl_signature_scheme_t *scheme;
    EVP_MD_CTX *ctx = NULL;
    EVP_PKEY_CTX *pkey_ctx = NULL;
    int ret = 0;

    if (data.base == NULL)
        goto Exit;

    if ((scheme = lookup_signature_schemes(key)) == NULL) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    for (; scheme->scheme_id != UINT16_MAX; ++scheme)
        if (scheme->scheme_id == algo)
            goto SchemeFound;
    ret = PTLS_ALERT_ILLEGAL_PARAMETER;
    goto Exit;

SchemeFound:
    if ((ctx = EVP_MD_CTX_create()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }

#if PTLS_OPENSSL_HAVE_ED25519
    if (EVP_PKEY_id(key) == EVP_PKEY_ED25519) {
        /* ED25519 requires the use of the all-at-once function that appeared in OpenSSL 1.1.1, hence different path */
        if (EVP_DigestVerifyInit(ctx, &pkey_ctx, NULL, NULL, key) != 1) {
            ret = PTLS_ERROR_LIBRARY;
            goto Exit;
        }
        if (EVP_DigestVerify(ctx, signature.base, signature.len, data.base, data.len) != 1) {
            ret = PTLS_ERROR_LIBRARY;
            goto Exit;
        }
    } else
#endif
    {
        if (EVP_DigestVerifyInit(ctx, &pkey_ctx, scheme->scheme_md(), NULL, key) != 1) {
            ret = PTLS_ERROR_LIBRARY;
            goto Exit;
        }

        if (EVP_PKEY_id(key) == EVP_PKEY_RSA) {
            if (EVP_PKEY_CTX_set_rsa_padding(pkey_ctx, RSA_PKCS1_PSS_PADDING) != 1) {
                ret = PTLS_ERROR_LIBRARY;
                goto Exit;
            }
            if (EVP_PKEY_CTX_set_rsa_pss_saltlen(pkey_ctx, -1) != 1) {
                ret = PTLS_ERROR_LIBRARY;
                goto Exit;
            }
            if (EVP_PKEY_CTX_set_rsa_mgf1_md(pkey_ctx, scheme->scheme_md()) != 1) {
                ret = PTLS_ERROR_LIBRARY;
                goto Exit;
            }
        }
        if (EVP_DigestVerifyUpdate(ctx, data.base, data.len) != 1) {
            ret = PTLS_ERROR_LIBRARY;
            goto Exit;
        }
        if (EVP_DigestVerifyFinal(ctx, signature.base, signature.len) != 1) {
            ret = PTLS_ALERT_DECRYPT_ERROR;
            goto Exit;
        }
    }

    ret = 0;

Exit:
    if (ctx != NULL)
        EVP_MD_CTX_destroy(ctx);
    EVP_PKEY_free(key);
    return ret;
}